

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O3

void __thiscall
xs::PosixTestProcess::start
          (PosixTestProcess *this,char *name,char *params,char *workingDir,char *caseList)

{
  string *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  PosixTestProcess *pPVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  deBool dVar6;
  undefined8 *puVar7;
  Process *this_00;
  deUint64 dVar8;
  deFile *pdVar9;
  long *plVar10;
  Error *this_01;
  runtime_error *prVar11;
  size_type *psVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 uVar15;
  string cmdLine;
  FilePath logFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  FilePath local_128;
  PosixTestProcess *local_108;
  ulong *local_100;
  long local_f8;
  ulong local_f0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  char *local_a0;
  char *local_98;
  FilePath local_90;
  FilePath local_70;
  FilePath local_50;
  
  local_108 = this;
  local_98 = params;
  if (this->m_process != (Process *)0x0) {
    this_01 = (Error *)__cxa_allocate_exception(0x10);
    Error::Error(this_01,(char *)0x0,"!m_process",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/xsPosixTestProcess.cpp"
                 ,0xbe);
    __cxa_throw(this_01,&Error::typeinfo,std::runtime_error::~runtime_error);
  }
  cVar2 = *caseList;
  local_a0 = caseList;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,workingDir,(allocator<char> *)&local_148);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"TestResults.qpa","");
  de::FilePath::join(&local_70,&local_128,(FilePath *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_path._M_dataplus._M_p != &local_128.m_path.field_2) {
    operator_delete(local_128.m_path._M_dataplus._M_p,
                    local_128.m_path.field_2._M_allocated_capacity + 1);
  }
  _Var4._M_p = local_70.m_path._M_dataplus._M_p;
  __rhs = &local_108->m_logFileName;
  pcVar13 = (char *)(local_108->m_logFileName)._M_string_length;
  strlen(local_70.m_path._M_dataplus._M_p);
  std::__cxx11::string::_M_replace((ulong)__rhs,0,pcVar13,(ulong)_Var4._M_p);
  dVar6 = deFileExists((__rhs->_M_dataplus)._M_p);
  if (dVar6 != 0) {
    dVar6 = deDeleteFile((__rhs->_M_dataplus)._M_p);
    if (dVar6 == 0) {
LAB_00112fab:
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Failed to remove \'","");
      std::operator+(&local_148,&local_e0,__rhs);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_128.m_path._M_dataplus._M_p = (pointer)*plVar10;
      psVar12 = (size_type *)(plVar10 + 2);
      if ((size_type *)local_128.m_path._M_dataplus._M_p == psVar12) {
        local_128.m_path.field_2._M_allocated_capacity = *psVar12;
        local_128.m_path.field_2._8_8_ = plVar10[3];
        local_128.m_path._M_dataplus._M_p = (pointer)&local_128.m_path.field_2;
      }
      else {
        local_128.m_path.field_2._M_allocated_capacity = *psVar12;
      }
      local_128.m_path._M_string_length = plVar10[1];
      *plVar10 = (long)psVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::runtime_error::runtime_error(prVar11,(string *)&local_128);
      *(undefined ***)prVar11 = &PTR__runtime_error_0012a740;
      __cxa_throw(prVar11,&TestProcessException::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar6 = deFileExists((__rhs->_M_dataplus)._M_p);
    if (dVar6 != 0) goto LAB_00112fab;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,name,(allocator<char> *)&local_e0);
  bVar5 = de::FilePath::isAbsolutePath((FilePath *)&local_148);
  if (!bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,workingDir,(allocator<char> *)&local_90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,name,(allocator<char> *)&local_100);
    de::FilePath::join((FilePath *)&local_e0,&local_50,&local_90);
    name = local_e0._M_dataplus._M_p;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,name,(allocator<char> *)&local_100);
  pcVar13 = local_98;
  pPVar3 = local_108;
  paVar1 = &local_148.field_2;
  if (!bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_path._M_dataplus._M_p != &local_90.m_path.field_2) {
      operator_delete(local_90.m_path._M_dataplus._M_p,
                      local_90.m_path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.m_path._M_dataplus._M_p != &local_50.m_path.field_2) {
      operator_delete(local_50.m_path._M_dataplus._M_p,
                      local_50.m_path.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," --deqp-log-filename=","");
  de::FilePath::getBaseName_abi_cxx11_(&local_c0,&local_70);
  uVar14 = 0xf;
  if (local_100 != local_f0) {
    uVar14 = local_f0[0];
  }
  if (uVar14 < local_c0._M_string_length + local_f8) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      uVar15 = local_c0.field_2._M_allocated_capacity;
    }
    if (local_c0._M_string_length + local_f8 <= (ulong)uVar15) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,(ulong)local_100);
      goto LAB_00112d2a;
    }
  }
  puVar7 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_c0._M_dataplus._M_p);
LAB_00112d2a:
  psVar12 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_148.field_2._M_allocated_capacity = *psVar12;
    local_148.field_2._8_8_ = puVar7[3];
    local_148._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_148.field_2._M_allocated_capacity = *psVar12;
    local_148._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_148._M_string_length = puVar7[1];
  *puVar7 = psVar12;
  puVar7[1] = 0;
  *(undefined1 *)psVar12 = 0;
  std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_148._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if (cVar2 != '\0') {
    std::__cxx11::string::append((char *)&local_128);
  }
  if (*pcVar13 != '\0') {
    local_100 = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100," ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_100);
    psVar12 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148.field_2._8_8_ = puVar7[3];
      local_148._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_148.field_2._M_allocated_capacity = *psVar12;
      local_148._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_148._M_string_length = puVar7[1];
    *puVar7 = psVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_148._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != paVar1) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != local_f0) {
      operator_delete(local_100,local_f0[0] + 1);
    }
  }
  this_00 = (Process *)operator_new(8);
  de::Process::Process(this_00);
  pPVar3->m_process = this_00;
  pcVar13 = (char *)0x0;
  if (*workingDir != '\0') {
    pcVar13 = workingDir;
  }
  de::Process::start(this_00,local_128.m_path._M_dataplus._M_p,pcVar13);
  dVar8 = deGetMicroseconds();
  pPVar3->m_processStartTime = dVar8;
  pdVar9 = deProcess_getStdOut(pPVar3->m_process->m_process);
  if (pdVar9 != (deFile *)0x0) {
    pdVar9 = deProcess_getStdOut(pPVar3->m_process->m_process);
    posix::PipeReader::start(&pPVar3->m_stdOutReader,pdVar9);
  }
  pdVar9 = deProcess_getStdErr(pPVar3->m_process->m_process);
  if (pdVar9 != (deFile *)0x0) {
    pdVar9 = deProcess_getStdErr(pPVar3->m_process->m_process);
    posix::PipeReader::start(&pPVar3->m_stdErrReader,pdVar9);
  }
  if (cVar2 != '\0') {
    pdVar9 = deProcess_getStdIn(pPVar3->m_process->m_process);
    if (pdVar9 == (deFile *)0x0) {
      (*(pPVar3->super_TestProcess)._vptr_TestProcess[4])(pPVar3);
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_148._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Failed to write case list","");
      std::runtime_error::runtime_error(prVar11,(string *)&local_148);
      *(undefined ***)prVar11 = &PTR__runtime_error_0012a740;
      __cxa_throw(prVar11,&TestProcessException::typeinfo,std::runtime_error::~runtime_error);
    }
    posix::CaseListWriter::start(&pPVar3->m_caseListWriter,local_a0,pdVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.m_path._M_dataplus._M_p != &local_128.m_path.field_2) {
    operator_delete(local_128.m_path._M_dataplus._M_p,
                    local_128.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_path._M_dataplus._M_p != &local_70.m_path.field_2) {
    operator_delete(local_70.m_path._M_dataplus._M_p,
                    local_70.m_path.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PosixTestProcess::start (const char* name, const char* params, const char* workingDir, const char* caseList)
{
	bool hasCaseList = strlen(caseList) > 0;

	XS_CHECK(!m_process);

	de::FilePath logFilePath = de::FilePath::join(workingDir, "TestResults.qpa");
	m_logFileName = logFilePath.getPath();

	// Remove old file if such exists.
	if (deFileExists(m_logFileName.c_str()))
	{
		if (!deDeleteFile(m_logFileName.c_str()) || deFileExists(m_logFileName.c_str()))
			throw TestProcessException(string("Failed to remove '") + m_logFileName + "'");
	}

	// Construct command line.
	string cmdLine = de::FilePath(name).isAbsolutePath() ? name : de::FilePath::join(workingDir, name).getPath();
	cmdLine += string(" --deqp-log-filename=") + logFilePath.getBaseName();

	if (hasCaseList)
		cmdLine += " --deqp-stdin-caselist";

	if (strlen(params) > 0)
		cmdLine += string(" ") + params;

	DE_ASSERT(!m_process);
	m_process = new de::Process();

	try
	{
		m_process->start(cmdLine.c_str(), strlen(workingDir) > 0 ? workingDir : DE_NULL);
	}
	catch (const de::ProcessError& e)
	{
		delete m_process;
		m_process = DE_NULL;
		throw TestProcessException(e.what());
	}

	m_processStartTime = deGetMicroseconds();

	// Create stdout & stderr readers.
	if (m_process->getStdOut())
		m_stdOutReader.start(m_process->getStdOut());

	if (m_process->getStdErr())
		m_stdErrReader.start(m_process->getStdErr());

	// Start case list writer.
	if (hasCaseList)
	{
		deFile* dst = m_process->getStdIn();
		if (dst)
			m_caseListWriter.start(caseList, dst);
		else
		{
			cleanup();
			throw TestProcessException("Failed to write case list");
		}
	}
}